

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

char * Abc_SopEncoderLog(Mem_Flex_t *pMan,int iBit,int nValues)

{
  bool bVar1;
  int iVar2;
  Vec_Str_t *p;
  char *pcVar3;
  int nBits;
  int fFirst;
  int Counter;
  int v;
  Vec_Str_t *vSop;
  char *pResult;
  int nValues_local;
  int iBit_local;
  Mem_Flex_t *pMan_local;
  
  bVar1 = true;
  iVar2 = Abc_Base2Log(nValues);
  if (iBit < iVar2) {
    nBits = 0;
    for (fFirst = 0; fFirst < nValues; fFirst = fFirst + 1) {
      nBits = (uint)(0 < (fFirst & 1 << ((byte)iBit & 0x1f))) + nBits;
    }
    p = Vec_StrAlloc(100);
    Vec_StrPrintStr(p,"d0\n");
    if (1 < nBits) {
      Vec_StrPrintStr(p,"(");
    }
    for (fFirst = 0; fFirst < nValues; fFirst = fFirst + 1) {
      if ((fFirst & 1 << ((byte)iBit & 0x1f)) != 0) {
        if (bVar1) {
          bVar1 = false;
        }
        else {
          Vec_StrPush(p,',');
        }
        Vec_StrPrintNum(p,fFirst);
      }
    }
    if (1 < nBits) {
      Vec_StrPrintStr(p,")");
    }
    Vec_StrPrintStr(p," 1\n");
    Vec_StrPush(p,'\0');
    pcVar3 = Vec_StrArray(p);
    pcVar3 = Abc_SopRegister(pMan,pcVar3);
    Vec_StrFree(p);
    return pcVar3;
  }
  __assert_fail("iBit < nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                ,0x449,"char *Abc_SopEncoderLog(Mem_Flex_t *, int, int)");
}

Assistant:

char * Abc_SopEncoderLog( Mem_Flex_t * pMan, int iBit, int nValues )
{
    char * pResult;
    Vec_Str_t * vSop;
    int v, Counter, fFirst = 1, nBits = Abc_Base2Log(nValues);
    assert( iBit < nBits );
    // count the number of literals
    Counter = 0;
    for ( v = 0; v < nValues; v++ )
        Counter += ( (v & (1 << iBit)) > 0 );
    // create the cover
    vSop = Vec_StrAlloc( 100 );
    Vec_StrPrintStr( vSop, "d0\n" );
    if ( Counter > 1 )
        Vec_StrPrintStr( vSop, "(" );
    for ( v = 0; v < nValues; v++ )
        if ( v & (1 << iBit) )
        {
            if ( fFirst )
                fFirst = 0;
            else
                Vec_StrPush( vSop, ',' );
            Vec_StrPrintNum( vSop, v );
        }
    if ( Counter > 1 )
        Vec_StrPrintStr( vSop, ")" );
    Vec_StrPrintStr( vSop, " 1\n" );
    Vec_StrPush( vSop, 0 );
    pResult = Abc_SopRegister( pMan, Vec_StrArray(vSop) );
    Vec_StrFree( vSop );
    return pResult;
}